

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O3

void ProcessEDSectors(void)

{
  sector_t *psVar1;
  hash_t hVar2;
  void *__s;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  InitED();
  hVar2 = TMap<int,_EDSector,_THashTraits<int>,_TValueTraits<EDSector>_>::CountUsed(&EDSectors);
  if (hVar2 != 0) {
    uVar7 = (ulong)numsectors;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (long)uVar7) {
      uVar6 = uVar7 * 4;
    }
    __s = operator_new__(uVar6);
    memset(__s,0xff,uVar7 * 4);
    psVar1 = sectors;
    if (0 < numlines) {
      piVar3 = &lines->special;
      lVar4 = 0;
      iVar5 = numlines;
      do {
        if ((*piVar3 == 0xbe) && (piVar3[2] == 0xfd)) {
          *(int *)((long)__s +
                  ((long)*(sector_t **)(piVar3 + 0x14) - (long)psVar1 >> 1) * 0x4fcace213f2b3885) =
               piVar3[1];
          *piVar3 = 0;
          iVar5 = numlines;
        }
        lVar4 = lVar4 + 1;
        piVar3 = piVar3 + 0x26;
      } while (lVar4 < iVar5);
      uVar7 = (ulong)(uint)numsectors;
    }
    if (0 < (int)uVar7) {
      lVar8 = 0;
      lVar4 = 0;
      do {
        iVar5 = *(int *)((long)__s + lVar4 * 4);
        if (-1 < iVar5) {
          ProcessEDSector((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar8),iVar5);
          uVar7 = (ulong)(uint)numsectors;
        }
        lVar4 = lVar4 + 1;
        lVar8 = lVar8 + 0x268;
      } while (lVar4 < (int)uVar7);
    }
    operator_delete__(__s);
    return;
  }
  return;
}

Assistant:

void ProcessEDSectors()
{
	int i;

	InitED();
	if (EDSectors.CountUsed() == 0) return;	// don't waste time if there's no records.

	// collect all Extradata sector records up front so we do not need to search the complete line array for each sector separately.
	int *sectorrecord = new int[numsectors];
	memset(sectorrecord, -1, numsectors * sizeof(int));
	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Static_Init && lines[i].args[1] == Init_EDSector)
		{
			sectorrecord[lines[i].frontsector - sectors] = lines[i].args[0];
			lines[i].special = 0;
		}
	}
	for (i = 0; i < numsectors; i++)
	{
		if (sectorrecord[i] >= 0)
		{
			ProcessEDSector(&sectors[i], sectorrecord[i]);
		}
	}
	delete[] sectorrecord;
}